

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_UInt32 tt_cmap10_char_next(TT_CMap cmap,FT_UInt32 *pchar_code)

{
  FT_Byte *pFVar1;
  uint local_44;
  FT_UInt32 idx;
  FT_UInt32 count;
  FT_UInt32 start;
  FT_Byte *p;
  FT_UInt gindex;
  FT_UInt32 char_code;
  FT_Byte *table;
  FT_UInt32 *pchar_code_local;
  TT_CMap cmap_local;
  
  pFVar1 = cmap->data;
  p._0_4_ = 0;
  local_44 = (uint)pFVar1[0xc] << 0x18 | (uint)pFVar1[0xd] << 0x10 | (uint)pFVar1[0xe] << 8 |
             (uint)pFVar1[0xf];
  if (*pchar_code == 0xffffffff) {
    cmap_local._4_4_ = 0;
  }
  else {
    p._4_4_ = *pchar_code + 1;
    if (*pchar_code + 1 < local_44) {
      p._4_4_ = local_44;
    }
    local_44 = p._4_4_ - local_44;
    _count = pFVar1 + (ulong)(local_44 * 2) + 0x14;
    for (; local_44 <
           ((uint)pFVar1[0x10] << 0x18 | (uint)pFVar1[0x11] << 0x10 | (uint)pFVar1[0x12] << 8 |
           (uint)pFVar1[0x13]); local_44 = local_44 + 1) {
      p._0_4_ = (uint)CONCAT11(*_count,_count[1]);
      if ((uint)p != 0) break;
      if (p._4_4_ == 0xffffffff) {
        return 0;
      }
      p._4_4_ = p._4_4_ + 1;
      _count = _count + 2;
    }
    *pchar_code = p._4_4_;
    cmap_local._4_4_ = (uint)p;
  }
  return cmap_local._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  tt_cmap10_char_next( TT_CMap     cmap,
                       FT_UInt32  *pchar_code )
  {
    FT_Byte*   table     = cmap->data;
    FT_UInt32  char_code;
    FT_UInt    gindex    = 0;
    FT_Byte*   p         = table + 12;
    FT_UInt32  start     = TT_NEXT_ULONG( p );
    FT_UInt32  count     = TT_NEXT_ULONG( p );
    FT_UInt32  idx;


    if ( *pchar_code >= 0xFFFFFFFFUL )
      return 0;

    char_code = *pchar_code + 1;

    if ( char_code < start )
      char_code = start;

    idx = char_code - start;
    p  += 2 * idx;

    for ( ; idx < count; idx++ )
    {
      gindex = TT_NEXT_USHORT( p );
      if ( gindex != 0 )
        break;

      if ( char_code >= 0xFFFFFFFFUL )
        return 0;

      char_code++;
    }

    *pchar_code = char_code;
    return gindex;
  }